

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapelinear.cpp
# Opt level: O1

void pzshape::TPZShapeLinear::Expo(REAL x,int num,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  ulong uVar1;
  double local_48;
  REAL local_40;
  double local_38;
  
  if (0 < num) {
    local_48 = 1.0;
    local_40 = x;
    (*(phi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x20])
              (phi,0,0,&local_48);
    local_48 = 0.0;
    (*(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x20])
              (dphi,0,0,&local_48);
    if (num != 1) {
      (*(phi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x20])
                (phi,1,0,&local_40);
      local_48 = 1.0;
      (*(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x20])
                (dphi,0,1);
      if (2 < num) {
        uVar1 = 2;
        do {
          if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < (long)uVar1) ||
             ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
            local_38 = local_40;
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          local_48 = local_40 * phi->fElem[uVar1 - 1];
          (*(phi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0x20])(phi,uVar1,0,&local_48);
          if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < (long)uVar1) ||
             ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          local_48 = (double)(int)uVar1 * phi->fElem[uVar1 - 1];
          (*(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0x20])(dphi,0,uVar1,&local_48);
          uVar1 = uVar1 + 1;
        } while ((uint)num != uVar1);
      }
    }
  }
  return;
}

Assistant:

void TPZShapeLinear::Expo(REAL x,int num,TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi){
        // Quadratic or higher shape functions
        if(num <= 0) return;
        phi.Put(0,0,1.0);
        dphi.Put(0,0, 0.0);
        if(num == 1) return;
        phi.Put(1,0, x);
        dphi.Put(0,1, 1.0);
        int ord;
        for(ord = 2;ord<num;ord++) {
            phi.Put(ord,0, x*phi(ord-1,0));
            dphi.Put(0,ord, ord*phi(ord-1,0));
        }
    }